

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          OutputWriter *a_oOutput,bool a_bAddSignature)

{
  bool bVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  SI_Error SVar4;
  _List_node_base *a_names;
  char *pcVar5;
  _List_node_base *p_Var6;
  TNamesDepend oValues;
  TNamesDepend oKeys;
  TNamesDepend oSections;
  Converter convert;
  
  Converter::Converter(&convert,this->m_bStoreIsUtf8);
  if ((a_bAddSignature & this->m_bStoreIsUtf8) == 1) {
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,anon_var_dwarf_3a186);
  }
  oSections.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&oSections;
  oSections.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node._M_size = 0;
  oSections.
  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       oSections.
       super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  GetAllSections(this,(TNamesDepend *)
                      oSections.
                      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                      ._M_impl._M_node.super__List_node_base._M_next);
  std::__cxx11::
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>
            ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
              *)&oSections);
  SVar4 = SI_FAIL;
  if (this->m_pFileComment == (char *)0x0) {
    bVar2 = false;
  }
  else {
    bVar1 = OutputMultiLineText(this,a_oOutput,&convert,this->m_pFileComment);
    bVar2 = true;
    if (!bVar1) goto LAB_001804d6;
  }
  p_Var6 = (_List_node_base *)&oSections;
  do {
    a_names = (_List_node_base *)&oKeys;
    p_Var6 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)&oSections) {
      SVar4 = SI_OK;
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      goto LAB_001804d6;
    }
    p_Var3 = p_Var6[1]._M_prev;
    if (p_Var3 == (_List_node_base *)0x0) {
      if (bVar2) {
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        goto LAB_001802b3;
      }
    }
    else {
      if (bVar2) {
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        p_Var3 = p_Var6[1]._M_prev;
      }
      bVar2 = OutputMultiLineText(this,a_oOutput,&convert,(char *)p_Var3);
      if (!bVar2) break;
LAB_001802b3:
      bVar2 = false;
    }
    pcVar5 = (char *)p_Var6[1]._M_next;
    if (*pcVar5 != '\0') {
      bVar1 = Converter::ConvertToStore(&convert,pcVar5);
      if (!bVar1) break;
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"[");
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,convert.m_scratch._M_dataplus._M_p);
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"]");
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      pcVar5 = (char *)p_Var6[1]._M_next;
    }
    oKeys.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node._M_size = 0;
    oKeys.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node.super__List_node_base._M_next = a_names;
    oKeys.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node.super__List_node_base._M_prev = a_names;
    GetAllKeys(this,pcVar5,(TNamesDepend *)a_names);
    std::__cxx11::
    list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
    ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>
              ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                *)a_names);
    while (a_names = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                        *)&a_names->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          a_names != (_List_node_base *)&oKeys) {
      p_Var3 = (_List_node_base *)&oValues;
      oValues.
      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ._M_impl._M_node._M_size = 0;
      oValues.
      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var3;
      oValues.
      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ._M_impl._M_node.super__List_node_base._M_prev = p_Var3;
      GetAllValues(this,(char *)p_Var6[1]._M_next,(char *)a_names[1]._M_next,(TNamesDepend *)p_Var3)
      ;
      while (p_Var3 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                         *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&oValues) {
        if (p_Var3[1]._M_prev != (_List_node_base *)0x0) {
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
          bVar1 = OutputMultiLineText(this,a_oOutput,&convert,(char *)p_Var3[1]._M_prev);
          if (bVar1) goto LAB_001803b6;
LAB_00180495:
          std::__cxx11::
          _List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
          ::_M_clear(&oValues.
                      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                    );
          goto LAB_001804a4;
        }
LAB_001803b6:
        bVar1 = Converter::ConvertToStore(&convert,(char *)a_names[1]._M_next);
        if (!bVar1) goto LAB_00180495;
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,convert.m_scratch._M_dataplus._M_p);
        bVar1 = Converter::ConvertToStore(&convert,(char *)p_Var3[1]._M_next);
        if (!bVar1) goto LAB_00180495;
        pcVar5 = "=";
        if (this->m_bSpaces != false) {
          pcVar5 = " = ";
        }
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar5);
        if ((this->m_bAllowMultiLine == true) &&
           (bVar1 = IsMultiLineData(this,(char *)p_Var3[1]._M_next), bVar1)) {
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"<<<END_OF_TEXT\n");
          bVar1 = OutputMultiLineText(this,a_oOutput,&convert,(char *)p_Var3[1]._M_next);
          if (!bVar1) goto LAB_00180495;
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"END_OF_TEXT");
        }
        else {
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,convert.m_scratch._M_dataplus._M_p);
        }
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      }
      std::__cxx11::
      _List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ::_M_clear(&oValues.
                  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                );
    }
    bVar2 = true;
LAB_001804a4:
    std::__cxx11::
    _List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ::_M_clear(&oKeys.
                super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
              );
  } while (a_names ==
           (_List_node_base *)
           &oKeys.
            super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
          );
  SVar4 = SI_FAIL;
LAB_001804d6:
  std::__cxx11::
  _List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ::_M_clear(&oSections.
              super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
            );
  std::__cxx11::string::~string((string *)&convert.m_scratch);
  return SVar4;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::Save(OutputWriter &a_oOutput, bool a_bAddSignature) const {
	Converter convert(m_bStoreIsUtf8);

	// add the UTF-8 signature if it is desired
	if (m_bStoreIsUtf8 && a_bAddSignature) {
		a_oOutput.Write(SI_UTF8_SIGNATURE);
	}

	// get all of the sections sorted in load order
	TNamesDepend oSections;
	GetAllSections(oSections);
#if defined(_MSC_VER) && _MSC_VER <= 1200
	oSections.sort();
#elif defined(__BORLANDC__)
	oSections.sort(Entry::LoadOrder());
#else
	oSections.sort(typename Entry::LoadOrder());
#endif

	// write the file comment if we have one
	bool bNeedNewLine = false;
	if (m_pFileComment) {
		if (!OutputMultiLineText(a_oOutput, convert, m_pFileComment)) {
			return SI_FAIL;
		}
		bNeedNewLine = true;
	}

	// iterate through our sections and output the data
	typename TNamesDepend::const_iterator iSection = oSections.begin();
	for (; iSection != oSections.end(); ++iSection) {
		// write out the comment if there is one
		if (iSection->pComment) {
			if (bNeedNewLine) {
				a_oOutput.Write(SI_NEWLINE_A);
				a_oOutput.Write(SI_NEWLINE_A);
			}
			if (!OutputMultiLineText(a_oOutput, convert, iSection->pComment)) {
				return SI_FAIL;
			}
			bNeedNewLine = false;
		}

		if (bNeedNewLine) {
			a_oOutput.Write(SI_NEWLINE_A);
			a_oOutput.Write(SI_NEWLINE_A);
			bNeedNewLine = false;
		}

		// write the section (unless there is no section name)
		if (*iSection->pItem) {
			if (!convert.ConvertToStore(iSection->pItem)) {
				return SI_FAIL;
			}
			a_oOutput.Write("[");
			a_oOutput.Write(convert.Data());
			a_oOutput.Write("]");
			a_oOutput.Write(SI_NEWLINE_A);
		}

		// get all of the keys sorted in load order
		TNamesDepend oKeys;
		GetAllKeys(iSection->pItem, oKeys);
#if defined(_MSC_VER) && _MSC_VER <= 1200
		oKeys.sort();
#elif defined(__BORLANDC__)
		oKeys.sort(Entry::LoadOrder());
#else
		oKeys.sort(typename Entry::LoadOrder());
#endif

		// write all keys and values
		typename TNamesDepend::const_iterator iKey = oKeys.begin();
		for (; iKey != oKeys.end(); ++iKey) {
			// get all values for this key
			TNamesDepend oValues;
			GetAllValues(iSection->pItem, iKey->pItem, oValues);

			typename TNamesDepend::const_iterator iValue = oValues.begin();
			for (; iValue != oValues.end(); ++iValue) {
				// write out the comment if there is one
				if (iValue->pComment) {
					a_oOutput.Write(SI_NEWLINE_A);
					if (!OutputMultiLineText(a_oOutput, convert, iValue->pComment)) {
						return SI_FAIL;
					}
				}

				// write the key
				if (!convert.ConvertToStore(iKey->pItem)) {
					return SI_FAIL;
				}
				a_oOutput.Write(convert.Data());

				// write the value
				if (!convert.ConvertToStore(iValue->pItem)) {
					return SI_FAIL;
				}
				a_oOutput.Write(m_bSpaces ? " = " : "=");
				if (m_bAllowMultiLine && IsMultiLineData(iValue->pItem)) {
					// multi-line data needs to be processed specially to ensure
					// that we use the correct newline format for the current system
					a_oOutput.Write("<<<END_OF_TEXT" SI_NEWLINE_A);
					if (!OutputMultiLineText(a_oOutput, convert, iValue->pItem)) {
						return SI_FAIL;
					}
					a_oOutput.Write("END_OF_TEXT");
				} else {
					a_oOutput.Write(convert.Data());
				}
				a_oOutput.Write(SI_NEWLINE_A);
			}
		}

		bNeedNewLine = true;
	}

	// Append new empty line
	a_oOutput.Write(SI_NEWLINE_A);

	return SI_OK;
}